

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Functional::TextureSizeCase::genVertexShader_abi_cxx11_
          (string *__return_storage_ptr__,TextureSizeCase *this)

{
  char *__s;
  size_t sVar1;
  ostream *poVar2;
  ostringstream vert;
  undefined1 auStack_198 [8];
  long local_190 [14];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"#version 300 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"in highp vec4 a_position;\n",0x1a);
  if (this->m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"out mediump vec4 v_color;\n",0x1a);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"uniform highp ",0xe);
    __s = this->m_samplerTypeStr;
    if (__s == (char *)0x0) {
      std::ios::clear((int)auStack_198 + (int)*(undefined8 *)(local_190[0] + -0x18) + 8);
    }
    else {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,__s,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190," u_sampler;\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"uniform highp ivec",0x12);
    poVar2 = (ostream *)std::ostream::operator<<(local_190,this->m_has3DSize | 2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," u_texSize;\n",0xc);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,"uniform highp int u_lod;\n",0x19);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"void main()\n{\n",0xe);
  if (this->m_isVertexCase == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_190,
               "\tv_color = (textureSize(u_sampler, u_lod) == u_texSize ? vec4(1.0, 1.0, 1.0, 1.0) : vec4(0.0, 0.0, 0.0, 1.0));\n"
               ,0x6f);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"\tgl_Position = a_position;\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_190,"}\n",2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureSizeCase::genVertexShader() const
{
	std::ostringstream	vert;

	vert << "#version 300 es\n"
			<< "in highp vec4 a_position;\n";

	if (m_isVertexCase)
	{
		vert << "out mediump vec4 v_color;\n";
		vert << "uniform highp " << m_samplerTypeStr << " u_sampler;\n";
		vert << "uniform highp ivec" << (m_has3DSize ? 3 : 2) << " u_texSize;\n";
		vert << "uniform highp int u_lod;\n";
	}

	vert << "void main()\n{\n";

	if (m_isVertexCase)
		vert << "	v_color = (textureSize(u_sampler, u_lod) == u_texSize ? vec4(1.0, 1.0, 1.0, 1.0) : vec4(0.0, 0.0, 0.0, 1.0));\n";

	vert << "	gl_Position = a_position;\n"
			<< "}\n";

	return vert.str();
}